

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_TestShell::
~TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_TestShell
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestFileShouldContainAnEmptyPropertiesBlock)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<properties>\n", outputFile->line(3));
    STRCMP_EQUAL("</properties>\n", outputFile->line(4));
}